

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall
ncnn::Net::forward_layer
          (Net *this,int layer_index,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats,
          Option *opt)

{
  Mat *pMVar1;
  undefined8 *puVar2;
  Layer *__arg;
  int *piVar3;
  long *plVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  void *pvVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  int iVar14;
  pointer piVar15;
  long lVar16;
  ulong uVar17;
  pointer pMVar18;
  pointer pMVar19;
  bool bVar20;
  Mat bottom_blob_packed_1;
  Mat bottom_blob_packed;
  int local_d0;
  int local_cc;
  Mat local_c8;
  allocator_type local_79;
  Mat local_78;
  Net *local_38;
  
  __arg = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
          super__Vector_impl_data._M_start[layer_index];
  local_38 = this;
  if (__arg->one_blob_only == true) {
    iVar14 = *(__arg->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar13 = *(__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (((blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
         super__Vector_impl_data._M_start[iVar14].dims == 0) &&
       (local_cc = forward_layer(this,(this->blobs).
                                      super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                      _M_impl.super__Vector_impl_data._M_start[iVar14].producer,
                                 blob_mats,opt), local_cc != 0)) {
      bVar20 = false;
      local_d0 = local_cc;
    }
    else {
      pMVar18 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      local_c8.data = pMVar18[iVar14].data;
      piVar3 = pMVar18[iVar14].refcount;
      local_c8.refcount._0_4_ = SUB84(piVar3,0);
      local_c8.refcount._4_4_ = (undefined4)((ulong)piVar3 >> 0x20);
      local_c8.elemsize._0_4_ = (undefined4)pMVar18[iVar14].elemsize;
      local_c8.elemsize._4_4_ = (undefined4)(pMVar18[iVar14].elemsize >> 0x20);
      local_c8.elempack = pMVar18[iVar14].elempack;
      local_c8.allocator = pMVar18[iVar14].allocator;
      pMVar19 = pMVar18 + iVar14;
      local_c8.dims = pMVar19->dims;
      local_c8.w = pMVar19->w;
      local_c8._48_8_ = *(undefined8 *)(&pMVar19->dims + 2);
      local_c8.cstep = pMVar18[iVar14].cstep;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      if (opt->lightmode == true) {
        pMVar19 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pMVar18 = pMVar19 + iVar14;
        piVar3 = pMVar19[iVar14].refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (pMVar18->allocator == (Allocator *)0x0) {
              if (pMVar18->data != (void *)0x0) {
                free(pMVar18->data);
              }
            }
            else {
              (*pMVar18->allocator->_vptr_Allocator[3])();
            }
          }
        }
        *(undefined8 *)((long)&pMVar18->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar18->elemsize + 4) = 0;
        pMVar18->data = (void *)0x0;
        pMVar18->refcount = (int *)0x0;
        pMVar18->dims = 0;
        pMVar18->w = 0;
        pMVar18->h = 0;
        pMVar18->c = 0;
        pMVar18->cstep = 0;
        if ((__arg->support_inplace == true) &&
           (*(int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_) != 1)) {
          if ((local_c8.data == (void *)0x0) || (local_c8.cstep * (long)local_c8.c == 0)) {
            local_78.elemsize._0_4_ = 0;
            local_78.elemsize._4_4_ = 0;
            local_78.elempack = 0;
            local_78.data = (void *)0x0;
            local_78.refcount._0_4_ = 0;
            local_78.refcount._4_4_ = 0;
            local_78.allocator = (Allocator *)0x0;
            local_78.dims = 0;
            local_78.w = 0;
            local_78.h = 0;
            local_78.c = 0;
            local_78.cstep = 0;
          }
          else {
            local_78.elemsize._0_4_ = 0;
            local_78.elemsize._4_4_ = 0;
            local_78.elempack = 0;
            local_78.data = (void *)0x0;
            local_78.refcount._0_4_ = 0;
            local_78.refcount._4_4_ = 0;
            local_78.allocator = (Allocator *)0x0;
            local_78.dims = 0;
            local_78.w = 0;
            local_78.h = 0;
            local_78.c = 0;
            local_78.cstep = 0;
            if (local_c8.dims == 3) {
              Mat::create(&local_78,local_c8.w,local_c8.h,local_c8.c,
                          CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize),
                          local_c8.elempack,(Allocator *)0x0);
            }
            else if (local_c8.dims == 2) {
              Mat::create(&local_78,local_c8.w,local_c8.h,
                          CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize),
                          local_c8.elempack,(Allocator *)0x0);
            }
            else if (local_c8.dims == 1) {
              Mat::create(&local_78,local_c8.w,
                          CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize),
                          local_c8.elempack,(Allocator *)0x0);
            }
            if ((long)local_c8.c * local_c8.cstep != 0) {
              memcpy(local_78.data,local_c8.data,
                     (long)local_c8.c * local_c8.cstep *
                     CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
            }
          }
          piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (local_c8.allocator == (Allocator *)0x0) {
                if (local_c8.data != (void *)0x0) {
                  free(local_c8.data);
                }
              }
              else {
                (*(local_c8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
          local_c8.data = local_78.data;
          local_c8.refcount._0_4_ = local_78.refcount._0_4_;
          local_c8.refcount._4_4_ = local_78.refcount._4_4_;
          local_c8.elemsize._0_4_ = (undefined4)local_78.elemsize;
          local_c8.elemsize._4_4_ = local_78.elemsize._4_4_;
          local_c8.elempack = local_78.elempack;
          local_c8.allocator = local_78.allocator;
          uVar7._0_4_ = local_78.dims;
          uVar7._4_4_ = local_78.w;
          local_c8.dims = local_78.dims;
          local_c8.w = local_78.w;
          uVar8._0_4_ = local_78.h;
          uVar8._4_4_ = local_78.c;
          local_c8.h = local_78.h;
          local_c8.c = local_78.c;
          local_c8.cstep = local_78.cstep;
          uVar11 = uVar7;
          uVar12 = uVar8;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            uVar11 = local_c8._40_8_;
            uVar12 = local_c8._48_8_;
            if (*piVar3 == 0) {
              if (local_78.allocator == (Allocator *)0x0) {
                if (local_78.data != (void *)0x0) {
                  local_c8._40_8_ = uVar7;
                  local_c8._48_8_ = uVar8;
                  free(local_78.data);
                  uVar11 = local_c8._40_8_;
                  uVar12 = local_c8._48_8_;
                }
              }
              else {
                local_c8._40_8_ = uVar7;
                local_c8._48_8_ = uVar8;
                (*(local_78.allocator)->_vptr_Allocator[3])();
                uVar11 = local_c8._40_8_;
                uVar12 = local_c8._48_8_;
              }
            }
          }
          local_c8._48_8_ = uVar12;
          local_c8._40_8_ = uVar11;
          local_78.elemsize._0_4_ = 0;
          local_78.elemsize._4_4_ = 0;
          local_78.elempack = 0;
          local_78.data = (void *)0x0;
          local_78.refcount._0_4_ = 0;
          local_78.refcount._4_4_ = 0;
          local_78.dims = 0;
          local_78.w = 0;
          local_78.h = 0;
          local_78.c = 0;
          local_78.cstep = 0;
        }
      }
      if (opt->use_packing_layout == true) {
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.c = 0;
        local_78.cstep = 0;
        convert_packing(&local_c8,&local_78,
                        (uint)__arg->support_packing + (uint)__arg->support_packing * 2 + 1,opt);
        piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_c8.allocator == (Allocator *)0x0) {
              if (local_c8.data != (void *)0x0) {
                free(local_c8.data);
              }
            }
            else {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        local_c8.data = local_78.data;
        local_c8.refcount._0_4_ = local_78.refcount._0_4_;
        local_c8.refcount._4_4_ = local_78.refcount._4_4_;
        local_c8.elemsize._0_4_ = (undefined4)local_78.elemsize;
        local_c8.elemsize._4_4_ = local_78.elemsize._4_4_;
        local_c8.elempack = local_78.elempack;
        local_c8.allocator = local_78.allocator;
        uVar11._0_4_ = local_78.dims;
        uVar11._4_4_ = local_78.w;
        local_c8.dims = local_78.dims;
        local_c8.w = local_78.w;
        uVar12._0_4_ = local_78.h;
        uVar12._4_4_ = local_78.c;
        local_c8.h = local_78.h;
        local_c8.c = local_78.c;
        local_c8.cstep = local_78.cstep;
        uVar7 = uVar11;
        uVar8 = uVar12;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          uVar7 = local_c8._40_8_;
          uVar8 = local_c8._48_8_;
          if (*piVar3 == 0) {
            if (local_78.allocator == (Allocator *)0x0) {
              if (local_78.data != (void *)0x0) {
                local_c8._40_8_ = uVar11;
                local_c8._48_8_ = uVar12;
                free(local_78.data);
                uVar7 = local_c8._40_8_;
                uVar8 = local_c8._48_8_;
              }
            }
            else {
              local_c8._40_8_ = uVar11;
              local_c8._48_8_ = uVar12;
              (*(local_78.allocator)->_vptr_Allocator[3])();
              uVar7 = local_c8._40_8_;
              uVar8 = local_c8._48_8_;
            }
          }
        }
        local_c8._48_8_ = uVar8;
        local_c8._40_8_ = uVar7;
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.c = 0;
        local_78.cstep = 0;
      }
      if ((opt->lightmode == true) && (__arg->support_inplace == true)) {
        iVar14 = (*__arg->_vptr_Layer[9])(__arg,&local_c8,opt);
        local_d0 = iVar14;
        if ((iVar14 == 0) &&
           (pMVar18 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start + iVar13, local_d0 = local_cc,
           pMVar18 != &local_c8)) {
          piVar3 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = pMVar18->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (pMVar18->allocator == (Allocator *)0x0) {
                if (pMVar18->data != (void *)0x0) {
                  free(pMVar18->data);
                }
              }
              else {
                (*pMVar18->allocator->_vptr_Allocator[3])();
              }
            }
          }
          *(undefined8 *)((long)&pMVar18->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar18->elemsize + 4) = 0;
          pMVar18->data = (void *)0x0;
          pMVar18->refcount = (int *)0x0;
          pMVar18->dims = 0;
          pMVar18->w = 0;
          pMVar18->h = 0;
          pMVar18->c = 0;
          pMVar18->cstep = 0;
          pMVar18->data = local_c8.data;
          pMVar18->refcount = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          pMVar18->elemsize = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
          pMVar18->elempack = local_c8.elempack;
          pMVar18->allocator = local_c8.allocator;
          pMVar18->dims = local_c8.dims;
          pMVar18->w = local_c8.w;
          pMVar18->h = local_c8.h;
          pMVar18->c = local_c8.c;
          pMVar18->cstep = local_c8.cstep;
        }
      }
      else {
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.c = 0;
        local_78.cstep = 0;
        iVar14 = (*__arg->_vptr_Layer[7])(__arg,&local_c8,&local_78,opt);
        local_d0 = iVar14;
        if ((iVar14 == 0) &&
           (pMVar18 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start + iVar13, local_d0 = local_cc,
           pMVar18 != &local_78)) {
          piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          piVar3 = pMVar18->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (pMVar18->allocator == (Allocator *)0x0) {
                if (pMVar18->data != (void *)0x0) {
                  free(pMVar18->data);
                }
              }
              else {
                (*pMVar18->allocator->_vptr_Allocator[3])();
              }
            }
          }
          *(undefined8 *)((long)&pMVar18->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar18->elemsize + 4) = 0;
          pMVar18->data = (void *)0x0;
          pMVar18->refcount = (int *)0x0;
          pMVar18->dims = 0;
          pMVar18->w = 0;
          pMVar18->h = 0;
          pMVar18->c = 0;
          pMVar18->cstep = 0;
          pMVar18->data = local_78.data;
          pMVar18->refcount = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
          pMVar18->elemsize = CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
          pMVar18->elempack = local_78.elempack;
          pMVar18->allocator = local_78.allocator;
          pMVar18->dims = local_78.dims;
          pMVar18->w = local_78.w;
          pMVar18->h = local_78.h;
          pMVar18->c = local_78.c;
          pMVar18->cstep = local_78.cstep;
        }
        piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (local_78.allocator == (Allocator *)0x0) {
              if (local_78.data != (void *)0x0) {
                free(local_78.data);
              }
            }
            else {
              (*(local_78.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      bVar20 = iVar14 == 0;
      piVar3 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_c8.allocator == (Allocator *)0x0) {
            if (local_c8.data != (void *)0x0) {
              free(local_c8.data);
            }
          }
          else {
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  else {
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_78,
               (long)(__arg->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               *(long *)&(__arg->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data >> 2,(allocator_type *)&local_c8);
    piVar15 = (__arg->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    bVar20 = (__arg->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish != piVar15;
    if (bVar20) {
      lVar16 = 0;
      uVar17 = 0;
      do {
        iVar14 = piVar15[uVar17];
        if (((blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start[iVar14].dims == 0) &&
           (iVar13 = forward_layer(local_38,(local_38->blobs).
                                            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                                            ._M_impl.super__Vector_impl_data._M_start[iVar14].
                                            producer,blob_mats,opt), iVar13 != 0)) {
          bVar9 = false;
          local_d0 = iVar13;
        }
        else {
          pvVar10 = local_78.data;
          pMVar19 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start + iVar14;
          pMVar18 = (pointer)((long)local_78.data + lVar16);
          if (pMVar18 != pMVar19) {
            piVar3 = pMVar19->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + 1;
              UNLOCK();
            }
            piVar3 = *(int **)((long)local_78.data + lVar16 + 8);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                plVar4 = *(long **)((long)local_78.data + lVar16 + 0x20);
                if (plVar4 == (long *)0x0) {
                  if (*(void **)((long)local_78.data + lVar16) != (void *)0x0) {
                    free(*(void **)((long)local_78.data + lVar16));
                  }
                }
                else {
                  (**(code **)(*plVar4 + 0x18))();
                }
              }
            }
            *(undefined8 *)((long)&pMVar18->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar18->elemsize + 4) = 0;
            pMVar18->data = (void *)0x0;
            pMVar18->refcount = (int *)0x0;
            puVar2 = (undefined8 *)((long)pvVar10 + lVar16 + 0x28);
            *puVar2 = 0;
            puVar2[1] = 0;
            *(undefined8 *)((long)pvVar10 + lVar16 + 0x38) = 0;
            piVar3 = pMVar19->refcount;
            *(undefined8 *)((long)pvVar10 + lVar16) = pMVar19->data;
            ((undefined8 *)((long)pvVar10 + lVar16))[1] = piVar3;
            *(size_t *)((long)pvVar10 + lVar16 + 0x10) = pMVar19->elemsize;
            *(int *)((long)pvVar10 + lVar16 + 0x18) = pMVar19->elempack;
            *(Allocator **)((long)pvVar10 + lVar16 + 0x20) = pMVar19->allocator;
            iVar13 = pMVar19->w;
            iVar5 = pMVar19->h;
            iVar6 = pMVar19->c;
            piVar3 = (int *)((long)pvVar10 + lVar16 + 0x28);
            *piVar3 = pMVar19->dims;
            piVar3[1] = iVar13;
            piVar3[2] = iVar5;
            piVar3[3] = iVar6;
            *(size_t *)((long)pvVar10 + lVar16 + 0x38) = pMVar19->cstep;
          }
          if (opt->lightmode == true) {
            pMVar19 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            pMVar18 = pMVar19 + iVar14;
            piVar3 = pMVar19[iVar14].refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (pMVar18->allocator == (Allocator *)0x0) {
                  if (pMVar18->data != (void *)0x0) {
                    free(pMVar18->data);
                  }
                }
                else {
                  (*pMVar18->allocator->_vptr_Allocator[3])();
                }
              }
            }
            *(undefined8 *)((long)&pMVar18->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar18->elemsize + 4) = 0;
            pMVar18->data = (void *)0x0;
            pMVar18->refcount = (int *)0x0;
            pMVar18->dims = 0;
            pMVar18->w = 0;
            pMVar18->h = 0;
            pMVar18->c = 0;
            pMVar18->cstep = 0;
            if ((__arg->support_inplace == true) &&
               (**(int **)((long)local_78.data + lVar16 + 8) != 1)) {
              Mat::clone(&local_c8,(__fn *)((long)local_78.data + lVar16),(void *)0x0,(int)opt,__arg
                        );
              pvVar10 = local_78.data;
              pMVar1 = (Mat *)((long)local_78.data + lVar16);
              if (pMVar1 != &local_c8) {
                piVar3 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                if (piVar3 != (int *)0x0) {
                  LOCK();
                  *piVar3 = *piVar3 + 1;
                  UNLOCK();
                }
                piVar3 = *(int **)((long)local_78.data + lVar16 + 8);
                if (piVar3 != (int *)0x0) {
                  LOCK();
                  *piVar3 = *piVar3 + -1;
                  UNLOCK();
                  if (*piVar3 == 0) {
                    plVar4 = *(long **)((long)local_78.data + lVar16 + 0x20);
                    if (plVar4 == (long *)0x0) {
                      if (*(void **)((long)local_78.data + lVar16) != (void *)0x0) {
                        free(*(void **)((long)local_78.data + lVar16));
                      }
                    }
                    else {
                      (**(code **)(*plVar4 + 0x18))();
                    }
                  }
                }
                *(undefined8 *)((long)&pMVar1->refcount + 4) = 0;
                *(undefined8 *)((long)&pMVar1->elemsize + 4) = 0;
                pMVar1->data = (void *)0x0;
                pMVar1->refcount = (int *)0x0;
                puVar2 = (undefined8 *)((long)pvVar10 + lVar16 + 0x28);
                *puVar2 = 0;
                puVar2[1] = 0;
                *(undefined8 *)((long)pvVar10 + lVar16 + 0x38) = 0;
                *(undefined8 *)((long)pvVar10 + lVar16) = local_c8.data;
                ((undefined8 *)((long)pvVar10 + lVar16))[1] =
                     CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                *(ulong *)((long)pvVar10 + lVar16 + 0x10) =
                     CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
                *(int *)((long)pvVar10 + lVar16 + 0x18) = local_c8.elempack;
                *(Allocator **)((long)pvVar10 + lVar16 + 0x20) = local_c8.allocator;
                piVar3 = (int *)((long)pvVar10 + lVar16 + 0x28);
                *piVar3 = local_c8.dims;
                piVar3[1] = local_c8.w;
                piVar3[2] = local_c8.h;
                piVar3[3] = local_c8.c;
                *(size_t *)((long)pvVar10 + lVar16 + 0x38) = local_c8.cstep;
              }
              piVar3 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (local_c8.allocator == (Allocator *)0x0) {
                    if (local_c8.data != (void *)0x0) {
                      free(local_c8.data);
                    }
                  }
                  else {
                    (*(local_c8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_c8.elemsize._0_4_ = 0;
              local_c8.elemsize._4_4_ = 0;
              local_c8.elempack = 0;
              local_c8.data = (void *)0x0;
              local_c8.refcount._0_4_ = 0;
              local_c8.refcount._4_4_ = 0;
              local_c8.dims = 0;
              local_c8.w = 0;
              local_c8.h = 0;
              local_c8.c = 0;
              local_c8.cstep = 0;
            }
          }
          bVar9 = true;
          if (opt->use_packing_layout == true) {
            local_c8.elemsize._0_4_ = 0;
            local_c8.elemsize._4_4_ = 0;
            local_c8.elempack = 0;
            local_c8.data = (void *)0x0;
            local_c8.refcount._0_4_ = 0;
            local_c8.refcount._4_4_ = 0;
            local_c8.h = 0;
            local_c8.c = 0;
            local_c8.cstep = 0;
            local_c8.allocator = (Allocator *)0x0;
            local_c8.dims = 0;
            local_c8.w = 0;
            convert_packing((Mat *)((long)local_78.data + lVar16),&local_c8,
                            (uint)__arg->support_packing + (uint)__arg->support_packing * 2 + 1,opt)
            ;
            pvVar10 = local_78.data;
            pMVar1 = (Mat *)((long)local_78.data + lVar16);
            if (pMVar1 != &local_c8) {
              piVar3 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + 1;
                UNLOCK();
              }
              piVar3 = *(int **)((long)local_78.data + lVar16 + 8);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  plVar4 = *(long **)((long)local_78.data + lVar16 + 0x20);
                  if (plVar4 == (long *)0x0) {
                    if (*(void **)((long)local_78.data + lVar16) != (void *)0x0) {
                      free(*(void **)((long)local_78.data + lVar16));
                    }
                  }
                  else {
                    (**(code **)(*plVar4 + 0x18))();
                  }
                }
              }
              *(undefined8 *)((long)&pMVar1->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar1->elemsize + 4) = 0;
              pMVar1->data = (void *)0x0;
              pMVar1->refcount = (int *)0x0;
              puVar2 = (undefined8 *)((long)pvVar10 + lVar16 + 0x28);
              *puVar2 = 0;
              puVar2[1] = 0;
              *(undefined8 *)((long)pvVar10 + lVar16 + 0x38) = 0;
              *(undefined8 *)((long)pvVar10 + lVar16) = local_c8.data;
              ((undefined8 *)((long)pvVar10 + lVar16))[1] =
                   CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
              *(ulong *)((long)pvVar10 + lVar16 + 0x10) =
                   CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
              *(int *)((long)pvVar10 + lVar16 + 0x18) = local_c8.elempack;
              *(Allocator **)((long)pvVar10 + lVar16 + 0x20) = local_c8.allocator;
              piVar3 = (int *)((long)pvVar10 + lVar16 + 0x28);
              *piVar3 = local_c8.dims;
              piVar3[1] = local_c8.w;
              piVar3[2] = local_c8.h;
              piVar3[3] = local_c8.c;
              *(size_t *)((long)pvVar10 + lVar16 + 0x38) = local_c8.cstep;
            }
            piVar3 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (local_c8.allocator == (Allocator *)0x0) {
                  if (local_c8.data != (void *)0x0) {
                    free(local_c8.data);
                  }
                }
                else {
                  (*(local_c8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_c8.elemsize._0_4_ = 0;
            local_c8.elemsize._4_4_ = 0;
            local_c8.elempack = 0;
            local_c8.data = (void *)0x0;
            local_c8.refcount._0_4_ = 0;
            local_c8.refcount._4_4_ = 0;
            local_c8.dims = 0;
            local_c8.w = 0;
            local_c8.h = 0;
            local_c8.c = 0;
            local_c8.cstep = 0;
          }
        }
        if (!bVar9) break;
        uVar17 = uVar17 + 1;
        piVar15 = (__arg->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar16 = lVar16 + 0x40;
        bVar20 = uVar17 < (ulong)((long)(__arg->bottoms).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar15 >> 2);
      } while (bVar20);
    }
    if (bVar20) {
      bVar20 = false;
    }
    else {
      if ((opt->lightmode == true) && (__arg->support_inplace == true)) {
        iVar13 = (*__arg->_vptr_Layer[8])(__arg,&local_78,opt);
        iVar14 = iVar13;
        if ((iVar13 == 0) &&
           (piVar15 = (__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start, iVar14 = local_d0,
           (__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish != piVar15)) {
          lVar16 = 0;
          uVar17 = 0;
          do {
            pvVar10 = local_78.data;
            pMVar18 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start + piVar15[uVar17];
            if ((pointer)((long)local_78.data + lVar16) != pMVar18) {
              piVar3 = *(int **)((long)local_78.data + lVar16 + 8);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + 1;
                UNLOCK();
              }
              piVar3 = pMVar18->refcount;
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (pMVar18->allocator == (Allocator *)0x0) {
                    if (pMVar18->data != (void *)0x0) {
                      free(pMVar18->data);
                    }
                  }
                  else {
                    (*pMVar18->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              *(undefined8 *)((long)&pMVar18->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar18->elemsize + 4) = 0;
              pMVar18->data = (void *)0x0;
              pMVar18->refcount = (int *)0x0;
              pMVar18->dims = 0;
              pMVar18->w = 0;
              pMVar18->h = 0;
              pMVar18->c = 0;
              pMVar18->cstep = 0;
              piVar3 = (int *)((undefined8 *)((long)pvVar10 + lVar16))[1];
              pMVar18->data = *(void **)((long)pvVar10 + lVar16);
              pMVar18->refcount = piVar3;
              pMVar18->elemsize = *(size_t *)((long)pvVar10 + lVar16 + 0x10);
              pMVar18->elempack = *(int *)((long)pvVar10 + lVar16 + 0x18);
              pMVar18->allocator = *(Allocator **)((long)pvVar10 + lVar16 + 0x20);
              puVar2 = (undefined8 *)((long)pvVar10 + lVar16 + 0x28);
              uVar7 = *puVar2;
              uVar8 = puVar2[1];
              pMVar18->dims = (int)uVar7;
              pMVar18->w = (int)((ulong)uVar7 >> 0x20);
              pMVar18->h = (int)uVar8;
              pMVar18->c = (int)((ulong)uVar8 >> 0x20);
              pMVar18->cstep = *(size_t *)((long)pvVar10 + lVar16 + 0x38);
            }
            uVar17 = uVar17 + 1;
            piVar15 = (__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar16 = lVar16 + 0x40;
          } while (uVar17 < (ulong)((long)(__arg->tops).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish - (long)piVar15 >> 2));
        }
      }
      else {
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_c8,
                   (long)(__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   *(long *)&(__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data >> 2,&local_79);
        iVar13 = (*__arg->_vptr_Layer[6])(__arg,&local_78,&local_c8,opt);
        iVar14 = iVar13;
        if ((iVar13 == 0) &&
           (piVar15 = (__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start, iVar14 = local_d0,
           (__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish != piVar15)) {
          lVar16 = 0;
          uVar17 = 0;
          do {
            pvVar10 = local_c8.data;
            pMVar18 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start + piVar15[uVar17];
            if ((pointer)((long)local_c8.data + lVar16) != pMVar18) {
              piVar3 = *(int **)((long)local_c8.data + lVar16 + 8);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + 1;
                UNLOCK();
              }
              piVar3 = pMVar18->refcount;
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (pMVar18->allocator == (Allocator *)0x0) {
                    if (pMVar18->data != (void *)0x0) {
                      free(pMVar18->data);
                    }
                  }
                  else {
                    (*pMVar18->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              *(undefined8 *)((long)&pMVar18->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar18->elemsize + 4) = 0;
              pMVar18->data = (void *)0x0;
              pMVar18->refcount = (int *)0x0;
              pMVar18->dims = 0;
              pMVar18->w = 0;
              pMVar18->h = 0;
              pMVar18->c = 0;
              pMVar18->cstep = 0;
              piVar3 = (int *)((undefined8 *)((long)pvVar10 + lVar16))[1];
              pMVar18->data = *(void **)((long)pvVar10 + lVar16);
              pMVar18->refcount = piVar3;
              pMVar18->elemsize = *(size_t *)((long)pvVar10 + lVar16 + 0x10);
              pMVar18->elempack = *(int *)((long)pvVar10 + lVar16 + 0x18);
              pMVar18->allocator = *(Allocator **)((long)pvVar10 + lVar16 + 0x20);
              puVar2 = (undefined8 *)((long)pvVar10 + lVar16 + 0x28);
              uVar7 = *puVar2;
              uVar8 = puVar2[1];
              pMVar18->dims = (int)uVar7;
              pMVar18->w = (int)((ulong)uVar7 >> 0x20);
              pMVar18->h = (int)uVar8;
              pMVar18->c = (int)((ulong)uVar8 >> 0x20);
              pMVar18->cstep = *(size_t *)((long)pvVar10 + lVar16 + 0x38);
            }
            uVar17 = uVar17 + 1;
            piVar15 = (__arg->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar16 = lVar16 + 0x40;
          } while (uVar17 < (ulong)((long)(__arg->tops).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish - (long)piVar15 >> 2));
        }
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_c8);
      }
      bVar20 = iVar13 == 0;
      local_d0 = iVar14;
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_78);
  }
  if (bVar20) {
    local_d0 = 0;
  }
  return local_d0;
}

Assistant:

int Net::forward_layer(int layer_index, std::vector<Mat>& blob_mats, Option& opt) const
{
    const Layer* layer = layers[layer_index];

//     fprintf(stderr, "forward_layer %d %s\n", layer_index, layer->name.c_str());

    if (layer->one_blob_only)
    {
        // load bottom blob
        int bottom_blob_index = layer->bottoms[0];
        int top_blob_index = layer->tops[0];

        if (blob_mats[bottom_blob_index].dims == 0)
        {
            int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
            if (ret != 0)
                return ret;
        }

        Mat bottom_blob = blob_mats[bottom_blob_index];

        if (opt.lightmode)
        {
            // delete after taken in light mode
            blob_mats[bottom_blob_index].release();
            // deep copy for inplace forward if data is shared
            if (layer->support_inplace && *bottom_blob.refcount != 1)
            {
                bottom_blob = bottom_blob.clone();
            }
        }

        if (opt.use_packing_layout)
        {
            int elempack = layer->support_packing ? 4 : 1;

            Mat bottom_blob_packed;
            convert_packing(bottom_blob, bottom_blob_packed, elempack, opt);
            bottom_blob = bottom_blob_packed;
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            Mat& bottom_top_blob = bottom_blob;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward_inplace(bottom_top_blob, opt);
            double end = get_current_time();
            benchmark(layer, bottom_top_blob, bottom_top_blob, start, end);
#else
            int ret = layer->forward_inplace(bottom_top_blob, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = bottom_top_blob;
        }
        else
        {
            Mat top_blob;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward(bottom_blob, top_blob, opt);
            double end = get_current_time();
            benchmark(layer, bottom_blob, top_blob, start, end);
#else
            int ret = layer->forward(bottom_blob, top_blob, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = top_blob;
        }

    }
    else
    {
        // load bottom blobs
        std::vector<Mat> bottom_blobs(layer->bottoms.size());
        for (size_t i=0; i<layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            if (blob_mats[bottom_blob_index].dims == 0)
            {
                int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
                if (ret != 0)
                    return ret;
            }

            bottom_blobs[i] = blob_mats[bottom_blob_index];

            if (opt.lightmode)
            {
                // delete after taken in light mode
                blob_mats[bottom_blob_index].release();
                // deep copy for inplace forward if data is shared
                if (layer->support_inplace && *bottom_blobs[i].refcount != 1)
                {
                    bottom_blobs[i] = bottom_blobs[i].clone();
                }
            }

            if (opt.use_packing_layout)
            {
                int elempack = layer->support_packing ? 4 : 1;

                Mat bottom_blob_packed;
                convert_packing(bottom_blobs[i], bottom_blob_packed, elempack, opt);
                bottom_blobs[i] = bottom_blob_packed;
            }
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            std::vector<Mat>& bottom_top_blobs = bottom_blobs;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
            double end = get_current_time();
            benchmark(layer, start, end);
#else
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i=0; i<layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = bottom_top_blobs[i];
            }
        }
        else
        {
            std::vector<Mat> top_blobs(layer->tops.size());
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
            double end = get_current_time();
            benchmark(layer, start, end);
#else
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i=0; i<layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = top_blobs[i];
            }
        }
    }

//     fprintf(stderr, "forward_layer %d %s done\n", layer_index, layer->name.c_str());
//     const Mat& blob = blob_mats[layer->tops[0]];
//     fprintf(stderr, "[%-2d %-16s %-16s]  %d    blobs count = %-3d   size = %-3d x %-3d\n", layer_index, layer->type.c_str(), layer->name.c_str(), layer->tops[0], blob.c, blob.h, blob.w);

    return 0;
}